

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepidselect.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  PixelType PVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  Header *pHVar7;
  reference pvVar8;
  char *pcVar9;
  mapped_type *pmVar10;
  CompressedIDManifest *pCVar11;
  int *piVar12;
  DeepSlice *pDVar13;
  Channel *pCVar14;
  uint **ppuVar15;
  half *phVar16;
  reference pvVar17;
  reference this;
  reference ppuVar18;
  reference pvVar19;
  pointer pmVar20;
  uint *puVar21;
  reference pvVar22;
  reference pvVar23;
  long in_RSI;
  int in_EDI;
  DeepScanLineOutputPart outPart_3;
  OutputPart outPart_2;
  int c_2;
  float alpha;
  const_iterator i_4;
  const_iterator idGroup;
  bool good;
  int s;
  float maskAlpha;
  float totalAlpha;
  int outputSample;
  int x_1;
  int x;
  int c_1;
  int y;
  DeepScanLineOutputPart outPart_1;
  OutputPart outPart;
  FrameBuffer outBuf;
  DeepScanLineInputPart inPart;
  ConstIterator i_3;
  int c;
  DeepFrameBuffer buf;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> outputAlpha;
  vector<int,_std::allocator<int>_> pixelCounts;
  int i_2;
  vector<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
  scanPointers;
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  scanLine;
  IDManifest mfst;
  list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
  ids;
  int manifestPart;
  ConstIterator i_1;
  int channels;
  PixelType alphaChannelType;
  int alphaChannel;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  channelToPos;
  int width;
  Box2i dataWindow;
  ChannelList *inputChans;
  Header *inputHeader;
  int pt;
  MultiPartOutputFile output;
  int h_1;
  Header *inHdr;
  int h;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> hdrs;
  int i;
  MultiPartInputFile input;
  char *inputFile;
  char **matchArguments;
  int numMatchArguments;
  bool mask;
  undefined4 in_stack_fffffffffffff9e8;
  float in_stack_fffffffffffff9ec;
  undefined4 in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f4;
  undefined4 in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa04;
  undefined4 in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa0c;
  float in_stack_fffffffffffffa10;
  value_type in_stack_fffffffffffffa14;
  value_type in_stack_fffffffffffffa20;
  value_type in_stack_fffffffffffffa24;
  undefined2 in_stack_fffffffffffffa28;
  byte in_stack_fffffffffffffa2a;
  byte in_stack_fffffffffffffa2b;
  int in_stack_fffffffffffffa2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa30;
  int local_540;
  DeepScanLineOutputPart local_3e8 [8];
  OutputPart local_3e0 [8];
  int local_3d8;
  float local_3d4;
  _Self local_3d0;
  _Self local_3c8;
  iterator local_3c0;
  _List_const_iterator<std::__cxx11::list<match,_std::allocator<match>_>_> local_3b8;
  iterator local_3b0;
  _List_const_iterator<std::__cxx11::list<match,_std::allocator<match>_>_> local_3a8;
  byte local_399;
  int local_398;
  float local_394;
  float local_390;
  int local_38c;
  int local_388;
  int local_384;
  int local_380;
  int local_37c;
  undefined1 local_378 [8];
  undefined1 local_370 [64];
  char local_330 [48];
  undefined1 local_300 [84];
  int local_2ac;
  Slice local_2a8 [56];
  Slice local_270 [96];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdfc;
  pointer in_stack_fffffffffffffe00;
  list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
  *in_stack_fffffffffffffe08;
  IDManifest *in_stack_fffffffffffffe10;
  vector<int,_std::allocator<int>_> local_1e0;
  int local_1c8;
  vector<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
  local_1c0;
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  local_1a0;
  IDManifest local_188 [48];
  int local_158;
  allocator<char> local_151;
  string local_150 [32];
  undefined8 local_130;
  undefined8 local_128;
  int local_11c;
  undefined4 local_118;
  int local_114;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  undefined8 local_c8;
  Header *local_c0;
  int local_b4;
  MultiPartOutputFile local_b0 [20];
  int local_9c;
  Channel local_98 [16];
  undefined8 local_88;
  int local_80;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> local_78;
  int local_5c;
  undefined4 local_58;
  MultiPartInputFile local_48 [32];
  char *local_28;
  long local_20;
  int local_18;
  byte local_11;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 4) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "syntax: [--mask] input.exr match [match...] [--and match [match...]] output.exr\n"
                            );
    poVar6 = std::operator<<(poVar6,
                             " if --mask specified, writes a shallow EXR with a mask of the selected object(s) in the \'A\' channel\n"
                            );
    poVar6 = std::operator<<(poVar6,
                             " otherwise, writes a deep EXR only containing the selected object(s)\n"
                            );
    poVar6 = std::operator<<(poVar6,'\n');
    poVar6 = std::operator<<(poVar6," matches can be:\n");
    poVar6 = std::operator<<(poVar6,"   searchstring - match any component of any channel\n");
    poVar6 = std::operator<<(poVar6,"   componentname:searchstring - only match given component\n");
    poVar6 = std::operator<<(poVar6,
                             "   channelname:number - match specified numeric ID in given channel\n"
                            );
    poVar6 = std::operator<<(poVar6,'\n');
    poVar6 = std::operator<<(poVar6,
                             "\"A B --and C D\" means \"(must match either A or B) and also (must match either C or D)\"\n"
                            );
    poVar6 = std::operator<<(poVar6," e.g:\n");
    poVar6 = std::operator<<(poVar6,"  input.deep.exr blue output.deep.exr\n");
    poVar6 = std::operator<<(poVar6,
                             "  input.deep.exr material:blue --and model:blob output.deep.exr\n");
    poVar6 = std::operator<<(poVar6,
                             "  input.deep.exr material:blue material:red --and model:blob output.deep.exr\n"
                            );
    std::operator<<(poVar6,"  input.deep.exr particleid:3 output.deep.exr\n");
    local_4 = 1;
  }
  else {
    local_11 = 0;
    local_18 = in_EDI + -2;
    local_20 = in_RSI + 0x10;
    local_28 = *(char **)(in_RSI + 8);
    local_10 = in_RSI;
    local_8 = in_EDI;
    iVar4 = strcmp(*(char **)(in_RSI + 8),"--mask");
    if (iVar4 == 0) {
      local_11 = 1;
      local_18 = local_18 + -1;
      local_20 = local_20 + 8;
      local_28 = *(char **)(local_10 + 0x10);
    }
    pcVar9 = local_28;
    iVar4 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_48,pcVar9,iVar4,true);
    pHVar7 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_48);
    bVar2 = Imf_3_4::hasIDManifest(pHVar7);
    if ((bVar2 & 1) == 0) {
      std::operator<<((ostream *)&std::cerr,
                      "deepidselect requires an ID manifest in the EXR header\n");
      local_4 = 1;
      local_58 = 1;
    }
    else {
      for (local_5c = 0; iVar4 = local_5c, iVar5 = Imf_3_4::MultiPartInputFile::parts(),
          iVar4 < iVar5; local_5c = local_5c + 1) {
        Imf_3_4::MultiPartInputFile::header((int)local_48);
        Imf_3_4::Header::type_abi_cxx11_();
        bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
        if (bVar3) {
          std::operator<<((ostream *)&std::cerr,
                          "deepidselect currently only supports files which are entirely deep scanline files\n"
                         );
          local_4 = 1;
          local_58 = 1;
          goto LAB_0010851e;
        }
      }
      Imf_3_4::MultiPartInputFile::parts();
      std::allocator<Imf_3_4::Header>::allocator((allocator<Imf_3_4::Header> *)0x106dd5);
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
                ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                 CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
      std::allocator<Imf_3_4::Header>::~allocator((allocator<Imf_3_4::Header> *)0x106e01);
      if ((local_11 & 1) == 0) {
        for (local_9c = 0; iVar4 = local_9c, iVar5 = Imf_3_4::MultiPartInputFile::parts(),
            iVar4 < iVar5; local_9c = local_9c + 1) {
          pHVar7 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_48);
          pvVar8 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                             (&local_78,(long)local_9c);
          Imf_3_4::Header::operator=(pvVar8,pHVar7);
        }
      }
      else {
        for (local_80 = 0; iVar4 = local_80, iVar5 = Imf_3_4::MultiPartInputFile::parts(),
            iVar4 < iVar5; local_80 = local_80 + 1) {
          local_88 = Imf_3_4::MultiPartInputFile::header((int)local_48);
          Imf_3_4::Header::dataWindow();
          std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                    (&local_78,(long)local_80);
          Imf_3_4::Header::dataWindow();
          Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
                    ((Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                     (Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
          pvVar8 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                             (&local_78,(long)local_80);
          Imf_3_4::Header::setType((string *)pvVar8);
          Imf_3_4::Header::displayWindow();
          std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                    (&local_78,(long)local_80);
          Imf_3_4::Header::displayWindow();
          Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
                    ((Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                     (Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
          bVar2 = Imf_3_4::Header::hasView();
          if ((bVar2 & 1) != 0) {
            pvVar8 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                               (&local_78,(long)local_80);
            Imf_3_4::Header::view_abi_cxx11_();
            Imf_3_4::Header::setView((string *)pvVar8);
          }
          bVar2 = Imf_3_4::Header::hasName();
          if ((bVar2 & 1) != 0) {
            pvVar8 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                               (&local_78,(long)local_80);
            Imf_3_4::Header::name_abi_cxx11_();
            Imf_3_4::Header::setName((string *)pvVar8);
          }
          std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                    (&local_78,(long)local_80);
          pcVar9 = (char *)Imf_3_4::Header::channels();
          Imf_3_4::Channel::Channel(local_98,HALF,1,1,false);
          Imf_3_4::ChannelList::insert(pcVar9,(Channel *)"A");
        }
      }
      pcVar9 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
      pHVar7 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::data
                         ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)0x1071ba);
      iVar4 = Imf_3_4::MultiPartInputFile::parts();
      iVar5 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartOutputFile::MultiPartOutputFile(local_b0,pcVar9,pHVar7,iVar4,false,iVar5);
      for (local_b4 = 0; iVar4 = local_b4, iVar5 = Imf_3_4::MultiPartInputFile::parts(),
          iVar4 < iVar5; local_b4 = local_b4 + 1) {
        local_c0 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_48);
        local_c8 = Imf_3_4::Header::channels();
        Imf_3_4::Header::dataWindow();
        Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
                  ((Box<Imath_3_2::Vec2<int>_> *)
                   CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                   (Box<Imath_3_2::Vec2<int>_> *)
                   CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
        local_dc = (local_d0 - local_d8) + 1;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)0x107303);
        local_114 = -1;
        local_118 = 1;
        local_11c = 0;
        local_128 = Imf_3_4::ChannelList::begin();
        while( true ) {
          local_130 = Imf_3_4::ChannelList::end();
          bVar3 = Imf_3_4::operator!=((ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                                      (ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8))
          ;
          iVar4 = local_11c;
          if (!bVar3) break;
          Imf_3_4::ChannelList::ConstIterator::name((ConstIterator *)0x1073bb);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffa30,
                     (char *)CONCAT44(in_stack_fffffffffffffa2c,
                                      CONCAT13(in_stack_fffffffffffffa2b,
                                               CONCAT12(in_stack_fffffffffffffa2a,
                                                        in_stack_fffffffffffffa28))),
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                  *)in_stack_fffffffffffffa30,
                                 (key_type *)
                                 CONCAT44(in_stack_fffffffffffffa2c,
                                          CONCAT13(in_stack_fffffffffffffa2b,
                                                   CONCAT12(in_stack_fffffffffffffa2a,
                                                            in_stack_fffffffffffffa28))));
          *pmVar10 = iVar4;
          std::__cxx11::string::~string(local_150);
          std::allocator<char>::~allocator(&local_151);
          pcVar9 = Imf_3_4::ChannelList::ConstIterator::name((ConstIterator *)0x107450);
          iVar4 = strcmp(pcVar9,"A");
          if (iVar4 == 0) {
            local_114 = local_11c;
            pCVar14 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x107492);
            local_118 = *(undefined4 *)pCVar14;
          }
          local_11c = local_11c + 1;
          Imf_3_4::ChannelList::ConstIterator::operator++
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0))
          ;
        }
        bVar2 = Imf_3_4::hasIDManifest(local_c0);
        if ((bVar2 & 1) == 0) {
          local_540 = 0;
        }
        else {
          local_540 = local_b4;
        }
        local_158 = local_540;
        std::__cxx11::
        list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
        ::list((list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                *)0x1075a8);
        pHVar7 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_48);
        pCVar11 = (CompressedIDManifest *)Imf_3_4::idManifest(pHVar7);
        Imf_3_4::IDManifest::IDManifest(local_188,pCVar11);
        setIds(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char **)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
               in_stack_fffffffffffffdf0);
        std::
        allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
        ::allocator((allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                     *)0x107647);
        std::
        vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
        ::vector((vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
        std::
        allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
        ::~allocator((allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                      *)0x107673);
        std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>::allocator
                  ((allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_> *)
                   0x107698);
        std::
        vector<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
        ::vector((vector<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
        std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>::~allocator
                  ((allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_> *)
                   0x1076c4);
        for (local_1c8 = 0; local_1c8 < local_11c; local_1c8 = local_1c8 + 1) {
          std::
          vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
          ::operator[](&local_1a0,(long)local_1c8);
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::resize((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                   CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
          std::
          vector<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
          ::operator[](&local_1c0,(long)local_1c8);
          std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::resize
                    ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)
                     CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                     CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
        }
        std::allocator<int>::allocator((allocator<int> *)0x107802);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                   CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                   (allocator_type *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
        std::allocator<int>::~allocator((allocator<int> *)0x10782e);
        std::allocator<Imath_3_2::half>::allocator((allocator<Imath_3_2::half> *)0x107853);
        std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector
                  ((vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *)
                   CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                   CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                   (allocator_type *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
        std::allocator<Imath_3_2::half>::~allocator((allocator<Imath_3_2::half> *)0x10787f);
        Imf_3_4::DeepFrameBuffer::DeepFrameBuffer
                  ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10))
        ;
        piVar12 = std::vector<int,_std::allocator<int>_>::data
                            ((vector<int,_std::allocator<int>_> *)0x10789b);
        in_stack_fffffffffffff9f0 = 0;
        in_stack_fffffffffffff9e8 = 1;
        Imf_3_4::Slice::Slice
                  (local_2a8,UINT,(char *)((long)piVar12 - (long)local_d8),4,0,1,1,0.0,false,false);
        Imf_3_4::DeepFrameBuffer::insertSampleCountSlice(local_270);
        local_2ac = 0;
        local_300._72_8_ = Imf_3_4::ChannelList::begin();
        while( true ) {
          local_300._64_8_ = Imf_3_4::ChannelList::end();
          bVar3 = Imf_3_4::operator!=((ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                                      (ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8))
          ;
          if (!bVar3) break;
          pDVar13 = (DeepSlice *)
                    Imf_3_4::ChannelList::ConstIterator::name((ConstIterator *)0x107981);
          pCVar14 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x107995);
          PVar1 = *(PixelType *)pCVar14;
          std::
          vector<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
          ::operator[](&local_1c0,(long)local_2ac);
          ppuVar15 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::data
                               ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)0x1079c4)
          ;
          in_stack_fffffffffffffa00 = 0;
          in_stack_fffffffffffff9f0 = 1;
          in_stack_fffffffffffff9e8 = 1;
          Imf_3_4::DeepSlice::DeepSlice
                    ((DeepSlice *)(local_300 + 8),PVar1,(char *)((long)ppuVar15 - (long)local_d8),8,
                     0,4,1,1,0.0,false,false);
          Imf_3_4::DeepFrameBuffer::insert((char *)local_270,pDVar13);
          Imf_3_4::ChannelList::ConstIterator::operator++
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0))
          ;
          local_2ac = local_2ac + 1;
        }
        Imf_3_4::DeepScanLineInputPart::DeepScanLineInputPart
                  ((DeepScanLineInputPart *)local_300,local_48,local_b4);
        Imf_3_4::DeepScanLineInputPart::setFrameBuffer((DeepFrameBuffer *)local_300);
        if ((local_11 & 1) == 0) {
          Imf_3_4::DeepScanLineOutputPart::DeepScanLineOutputPart
                    ((DeepScanLineOutputPart *)local_378,local_b0,local_b4);
          Imf_3_4::DeepScanLineOutputPart::setFrameBuffer((DeepFrameBuffer *)local_378);
        }
        else {
          Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x107b27);
          phVar16 = std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::data
                              ((vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *)0x107b34
                              );
          in_stack_fffffffffffff9f0 = 0;
          in_stack_fffffffffffff9e8 = 1;
          Imf_3_4::Slice::Slice
                    ((Slice *)(local_370 + 8),HALF,(char *)((long)phVar16 - (long)local_d8),2,0,1,1,
                     0.0,false,false);
          Imf_3_4::FrameBuffer::insert(local_330,(Slice *)"A");
          Imf_3_4::OutputPart::OutputPart((OutputPart *)local_370,local_b0,local_b4);
          Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)local_370);
          Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x107bde);
        }
        for (local_37c = local_d4; local_37c <= local_cc; local_37c = local_37c + 1) {
          Imf_3_4::DeepScanLineInputPart::readPixelSampleCounts((int)local_300);
          for (local_380 = 0; local_380 < local_11c; local_380 = local_380 + 1) {
            for (local_384 = 0; local_384 < local_dc; local_384 = local_384 + 1) {
              pvVar17 = std::
                        vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                        ::operator[](&local_1a0,(long)local_380);
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[](pvVar17,(long)local_384);
              std::vector<int,_std::allocator<int>_>::operator[](&local_1e0,(long)local_384);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                         CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
              pvVar17 = std::
                        vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                        ::operator[](&local_1a0,(long)local_380);
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[](pvVar17,(long)local_384);
              in_stack_fffffffffffffa30 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x107d2e);
              this = std::
                     vector<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
                     ::operator[](&local_1c0,(long)local_380);
              ppuVar18 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::operator[]
                                   (this,(long)local_384);
              *ppuVar18 = (value_type)in_stack_fffffffffffffa30;
            }
          }
          Imf_3_4::DeepScanLineInputPart::readPixels((int)local_300);
          for (local_388 = 0; local_388 < local_dc; local_388 = local_388 + 1) {
            local_38c = 0;
            local_390 = 0.0;
            local_394 = 0.0;
            local_398 = 0;
            while (in_stack_fffffffffffffa2c = local_398,
                  pvVar19 = std::vector<int,_std::allocator<int>_>::operator[]
                                      (&local_1e0,(long)local_388),
                  in_stack_fffffffffffffa2c < *pvVar19) {
              local_399 = 1;
              local_3b0._M_node =
                   (_List_node_base *)
                   std::__cxx11::
                   list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                   ::begin((list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
              std::_List_const_iterator<std::__cxx11::list<match,_std::allocator<match>_>_>::
              _List_const_iterator(&local_3a8,&local_3b0);
              while( true ) {
                local_3c0._M_node =
                     (_List_node_base *)
                     std::__cxx11::
                     list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                     ::end((list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
                std::_List_const_iterator<std::__cxx11::list<match,_std::allocator<match>_>_>::
                _List_const_iterator(&local_3b8,&local_3c0);
                bVar3 = std::operator!=(&local_3a8,&local_3b8);
                in_stack_fffffffffffffa2b = local_399;
                if (!bVar3) {
                  in_stack_fffffffffffffa2b = 0;
                }
                if ((in_stack_fffffffffffffa2b & 1) == 0) break;
                local_399 = 0;
                std::_List_const_iterator<std::__cxx11::list<match,_std::allocator<match>_>_>::
                operator->((_List_const_iterator<std::__cxx11::list<match,_std::allocator<match>_>_>
                            *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                local_3c8._M_node =
                     (_List_node_base *)
                     std::__cxx11::list<match,_std::allocator<match>_>::begin
                               ((list<match,_std::allocator<match>_> *)
                                CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
                while( true ) {
                  std::_List_const_iterator<std::__cxx11::list<match,_std::allocator<match>_>_>::
                  operator->((_List_const_iterator<std::__cxx11::list<match,_std::allocator<match>_>_>
                              *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                  local_3d0._M_node =
                       (_List_node_base *)
                       std::__cxx11::list<match,_std::allocator<match>_>::end
                                 ((list<match,_std::allocator<match>_> *)
                                  CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
                  bVar3 = std::operator!=(&local_3c8,&local_3d0);
                  in_stack_fffffffffffffa2a = 0;
                  if (bVar3) {
                    in_stack_fffffffffffffa2a = local_399 ^ 0xff;
                  }
                  if ((in_stack_fffffffffffffa2a & 1) == 0) break;
                  pmVar20 = std::_List_const_iterator<match>::operator->
                                      ((_List_const_iterator<match> *)
                                       CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0)
                                      );
                  pvVar17 = std::
                            vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                            ::operator[](&local_1a0,(long)pmVar20->channel1);
                  pvVar22 = std::
                            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ::operator[](pvVar17,(long)local_388);
                  pvVar23 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                      (pvVar22,(long)local_398);
                  in_stack_fffffffffffffa24 = *pvVar23;
                  pmVar20 = std::_List_const_iterator<match>::operator->
                                      ((_List_const_iterator<match> *)
                                       CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0)
                                      );
                  if (in_stack_fffffffffffffa24 == pmVar20->id1) {
                    pmVar20 = std::_List_const_iterator<match>::operator->
                                        ((_List_const_iterator<match> *)
                                         CONCAT44(in_stack_fffffffffffff9f4,
                                                  in_stack_fffffffffffff9f0));
                    if (pmVar20->channel2 != -1) {
                      pmVar20 = std::_List_const_iterator<match>::operator->
                                          ((_List_const_iterator<match> *)
                                           CONCAT44(in_stack_fffffffffffff9f4,
                                                    in_stack_fffffffffffff9f0));
                      pvVar17 = std::
                                vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                ::operator[](&local_1a0,(long)pmVar20->channel2);
                      pvVar22 = std::
                                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ::operator[](pvVar17,(long)local_388);
                      pvVar23 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                          (pvVar22,(long)local_398);
                      in_stack_fffffffffffffa20 = *pvVar23;
                      pmVar20 = std::_List_const_iterator<match>::operator->
                                          ((_List_const_iterator<match> *)
                                           CONCAT44(in_stack_fffffffffffff9f4,
                                                    in_stack_fffffffffffff9f0));
                      if (in_stack_fffffffffffffa20 != pmVar20->id2) goto LAB_0010800c;
                    }
                    local_399 = 1;
                  }
LAB_0010800c:
                  std::_List_const_iterator<match>::operator++(&local_3c8);
                }
                std::_List_const_iterator<std::__cxx11::list<match,_std::allocator<match>_>_>::
                operator++(&local_3a8);
              }
              if ((local_11 & 1) == 0) {
                if ((local_399 & 1) != 0) {
                  for (local_3d8 = 0; local_3d8 < local_11c; local_3d8 = local_3d8 + 1) {
                    pvVar17 = std::
                              vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                              ::operator[](&local_1a0,(long)local_3d8);
                    pvVar22 = std::
                              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ::operator[](pvVar17,(long)local_388);
                    pvVar23 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                        (pvVar22,(long)local_398);
                    in_stack_fffffffffffffa14 = *pvVar23;
                    pvVar17 = std::
                              vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                              ::operator[](&local_1a0,(long)local_3d8);
                    pvVar22 = std::
                              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ::operator[](pvVar17,(long)local_388);
                    pvVar23 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                        (pvVar22,(long)local_38c);
                    *pvVar23 = in_stack_fffffffffffffa14;
                  }
                  local_38c = local_38c + 1;
                }
              }
              else {
                local_3d4 = 0.0;
                switch(local_118) {
                case 0:
                  pvVar17 = std::
                            vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                            ::operator[](&local_1a0,(long)local_114);
                  pvVar22 = std::
                            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ::operator[](pvVar17,(long)local_388);
                  pvVar23 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                      (pvVar22,(long)local_398);
                  local_3d4 = (float)*pvVar23;
                  break;
                case 1:
                  pvVar17 = std::
                            vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                            ::operator[](&local_1a0,(long)local_114);
                  std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[](pvVar17,(long)local_388);
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1080ed);
                  local_3d4 = Imath_3_2::half::operator_cast_to_float
                                        ((half *)CONCAT44(in_stack_fffffffffffff9f4,
                                                          in_stack_fffffffffffff9f0));
                  break;
                case 2:
                  pvVar17 = std::
                            vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                            ::operator[](&local_1a0,(long)local_114);
                  std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[](pvVar17,(long)local_388);
                  puVar21 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       0x1080a5);
                  local_3d4 = (float)puVar21[local_398];
                  break;
                case 3:
                }
                if ((local_399 & 1) != 0) {
                  local_394 = (1.0 - local_390) * local_3d4 + local_394;
                }
                local_390 = (1.0 - local_390) * local_3d4 + local_390;
              }
              local_398 = local_398 + 1;
            }
            if ((local_11 & 1) == 0) {
              in_stack_fffffffffffffa0c = local_38c;
              pvVar19 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&local_1e0,(long)local_388);
              *pvVar19 = in_stack_fffffffffffffa0c;
            }
            else {
              if (0.0 < local_390) {
                local_394 = local_394 / local_390;
              }
              in_stack_fffffffffffffa10 = local_394;
              std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::operator[]
                        ((vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *)
                         &stack0xfffffffffffffe00,(long)local_388);
              Imath_3_2::half::operator=
                        ((half *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                         in_stack_fffffffffffff9ec);
            }
          }
          if ((local_11 & 1) == 0) {
            Imf_3_4::DeepScanLineOutputPart::DeepScanLineOutputPart(local_3e8,local_b0,local_b4);
            Imf_3_4::DeepScanLineOutputPart::writePixels((int)local_3e8);
          }
          else {
            Imf_3_4::OutputPart::OutputPart(local_3e0,local_b0,local_b4);
            Imf_3_4::OutputPart::writePixels((int)local_3e0);
          }
        }
        Imf_3_4::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x10841e);
        std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::~vector
                  ((vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *)
                   CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
        std::
        vector<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
        ::~vector((vector<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>,_std::allocator<std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
        std::
        vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
        ::~vector((vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
        Imf_3_4::IDManifest::~IDManifest((IDManifest *)0x10845f);
        std::__cxx11::
        list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
        ::~list((list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                 *)0x10846c);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)0x108479);
      }
      Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(local_b0);
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector
                ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                 CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
      local_58 = 0;
    }
LAB_0010851e:
    Imf_3_4::MultiPartInputFile::~MultiPartInputFile
              ((MultiPartInputFile *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
  }
  return local_4;
}

Assistant:

int
main (int argc, const char* argv[])
{
    if (argc < 4)
    {
        cerr
            << "syntax: [--mask] input.exr match [match...] [--and match [match...]] output.exr\n"
            << " if --mask specified, writes a shallow EXR with a mask of the selected object(s) in the 'A' channel\n"
            << " otherwise, writes a deep EXR only containing the selected object(s)\n"
            << '\n'
            << " matches can be:\n"
            << "   searchstring - match any component of any channel\n"
            << "   componentname:searchstring - only match given component\n"
            << "   channelname:number - match specified numeric ID in given channel\n"
            << '\n'
            << "\"A B --and C D\" means \"(must match either A or B) and also (must match either C or D)\"\n"
            << " e.g:\n"
            << "  input.deep.exr blue output.deep.exr\n"
            << "  input.deep.exr material:blue --and model:blob output.deep.exr\n"
            << "  input.deep.exr material:blue material:red --and model:blob output.deep.exr\n"
            << "  input.deep.exr particleid:3 output.deep.exr\n";
        return 1;
    }

    bool         mask              = false;
    int          numMatchArguments = argc - 2;
    const char** matchArguments    = argv + 2;
    const char*  inputFile         = argv[1];
    if (strcmp (argv[1], "--mask") == 0)
    {
        mask = true;
        numMatchArguments--;
        matchArguments++;
        inputFile = argv[2];
    }

    MultiPartInputFile input (inputFile);

    if (!hasIDManifest (input.header (0)))
    {
        cerr << "deepidselect requires an ID manifest in the EXR header\n";
        return 1;
    }

    for (int i = 0; i < input.parts (); ++i)
    {
        if (input.header (i).type () != DEEPSCANLINE)
        {
            cerr
                << "deepidselect currently only supports files which are entirely deep scanline files\n";
            return 1;
        }
    }

    //
    // build output headers. For deep output, this is easy: just copy them over
    // for masks, build scanline images of the same dimensions, each with a single alpha channel
    //
    vector<Header> hdrs (input.parts ());
    if (mask)
    {
        for (int h = 0; h < input.parts (); ++h)
        {
            const Header& inHdr   = input.header (h);
            hdrs[h].dataWindow () = inHdr.dataWindow ();
            hdrs[h].setType (SCANLINEIMAGE);
            hdrs[h].displayWindow () = inHdr.displayWindow ();
            if (inHdr.hasView ()) { hdrs[h].setView (inHdr.view ()); }
            if (inHdr.hasName ()) { hdrs[h].setName (inHdr.name ()); }
            hdrs[h].channels ().insert ("A", Channel (HALF));
        }
    }
    else
    {
        for (int h = 0; h < input.parts (); ++h)
        {
            hdrs[h] = input.header (h);
        }
    }

    MultiPartOutputFile output (argv[argc - 1], hdrs.data (), input.parts ());

    // process each part individually

    for (int pt = 0; pt < input.parts (); ++pt)
    {
        const Header&      inputHeader = input.header (pt);
        const ChannelList& inputChans  = inputHeader.channels ();
        Box2i              dataWindow  = inputHeader.dataWindow ();
        int                width = dataWindow.max.x + 1 - dataWindow.min.x;

        map<string, int>
            channelToPos; // index of each channel as stored in scanLine object

        int       alphaChannel     = -1;
        PixelType alphaChannelType = HALF;

        int channels = 0;
        for (ChannelList::ConstIterator i = inputChans.begin ();
             i != inputChans.end ();
             ++i)
        {
            channelToPos[i.name ()] = channels;
            if (strcmp (i.name (), "A") == 0)
            {
                alphaChannel     = channels;
                alphaChannelType = i.channel ().type;
            }
            channels++;
        }

        // if the part has a manifest, use this part's manifest
        // otherwise use part 0's manifest.
        // (but reparse the manifest for every part in case the channel list has changed)
        //
        int               manifestPart = hasIDManifest (inputHeader) ? pt : 0;
        list<list<match>> ids;
        IDManifest        mfst = idManifest (input.header (manifestPart));

        setIds (mfst, ids, matchArguments, numMatchArguments, channelToPos);

        // store for an individual deep scanline. Accessed using scanLine[channelIndex][pixelIndex][sampleIndex]
        // where pixelIndex is 0 for the leftmost pixel (even if the dataWindow doesn't start at 0)
        vector<vector<vector<uint32_t>>> scanLine (channels);

        // pointers to the data in each channel for FrameBuffer
        vector<vector<uint32_t*>> scanPointers (channels);

        for (int i = 0; i < channels; ++i)
        {
            scanLine[i].resize (width);
            scanPointers[i].resize (width);
        }

        vector<int>  pixelCounts (width);
        vector<half> outputAlpha (
            width); // only required for --mask mode: stores output

        DeepFrameBuffer buf;
        buf.insertSampleCountSlice (Slice (
            UINT,
            (char*) pixelCounts.data () - dataWindow.min.x,
            sizeof (int),
            0));
        int c = 0;

        //
        // read all channels as their native type, so they round trip when writing deep
        //
        for (ChannelList::ConstIterator i = inputChans.begin ();
             i != inputChans.end ();
             ++i, ++c)
        {
            buf.insert (
                i.name (),
                DeepSlice (
                    i.channel ().type,
                    (char*) scanPointers[c].data () - dataWindow.min.x,
                    sizeof (char*),
                    0,
                    sizeof (int32_t)));
        }

        DeepScanLineInputPart inPart (input, pt);
        inPart.setFrameBuffer (buf);

        //
        // for mask, create an alpha channel and initialize a FrameBuffer with that data
        // otherwise, can use the deep frame buffer for both input and output, since the data is processed in-place
        //
        if (mask)
        {
            FrameBuffer outBuf;
            outBuf.insert (
                "A",
                Slice (
                    HALF,
                    (char*) outputAlpha.data () - dataWindow.min.x,
                    sizeof (half),
                    0));
            OutputPart outPart (output, pt);
            outPart.setFrameBuffer (outBuf);
        }
        else
        {
            DeepScanLineOutputPart outPart (output, pt);
            outPart.setFrameBuffer (buf);
        }

        for (int y = dataWindow.min.y; y <= dataWindow.max.y; ++y)
        {
            inPart.readPixelSampleCounts (y);
            for (int c = 0; c < channels; ++c)
            {
                for (int x = 0; x < width; ++x)
                {
                    scanLine[c][x].resize (pixelCounts[x]);
                    scanPointers[c][x] = scanLine[c][x].data ();
                }
            }

            inPart.readPixels (y);

            for (int x = 0; x < width; ++x)
            {
                int outputSample = 0;

                float totalAlpha = 0.f;
                float maskAlpha  = 0.f;

                for (int s = 0; s < pixelCounts[x]; ++s)
                {
                    //
                    // should sample s be retained?
                    // look for an entry in each 'and group' where all the required channels match their
                    // corresponding values
                    //

                    bool good = true;
                    for (list<list<match>>::const_iterator idGroup =
                             ids.begin ();
                         idGroup != ids.end () && good;
                         ++idGroup)
                    {
                        good = false;
                        for (list<match>::const_iterator i = idGroup->begin ();
                             i != idGroup->end () && !good;
                             ++i)
                        {
                            if (scanLine[i->channel1][x][s] == i->id1 &&
                                (i->channel2 == -1 ||
                                 scanLine[i->channel2][x][s] == i->id2))
                            {
                                good = true;
                            }
                        }
                    }

                    //
                    // deep output mode:
                    //   delete unwanted samples
                    // mask output node:
                    //   composite together wanted sample's alpha
                    //

                    if (mask)
                    {
                        //cast alpha to float, and composite
                        float alpha = 0.f;
                        switch (alphaChannelType)
                        {
                            case FLOAT:
                                alpha = *(float*) (&scanLine[alphaChannel][x]
                                                        .data ()[s]);
                                break;
                            case HALF:
                                alpha = *(half*) (&scanLine[alphaChannel][x]
                                                       .data ()[s]);
                                break;
                            case UINT:
                                alpha = scanLine[alphaChannel][x][s];
                                break; //wat! this is a weird thing to do,but whatever...
                            case NUM_PIXELTYPES: break;
                        }

                        if (good) { maskAlpha += (1.0 - totalAlpha) * alpha; }
                        totalAlpha += (1.0 - totalAlpha) * alpha;
                    }

                    else if (good)
                    {
                        // keep Sample: copy from original position into output position
                        // (so overwrite any samples that are to be deleted)
                        for (int c = 0; c < channels; ++c)
                        {
                            scanLine[c][x][outputSample] = scanLine[c][x][s];
                        }
                        outputSample++;
                    }
                }

                if (mask)
                {
                    if (totalAlpha > 0.f) { maskAlpha /= totalAlpha; }
                    outputAlpha[x] = maskAlpha;
                }
                else
                {
                    // update total count of samples
                    pixelCounts[x] = outputSample;
                }
            }

            //
            // write data out
            //
            if (mask)
            {
                OutputPart outPart (output, pt);
                outPart.writePixels (1);
            }
            else
            {
                DeepScanLineOutputPart outPart (output, pt);
                outPart.writePixels (1);
            }
        }
    }
}